

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O3

void absl::lts_20250127::str_format_internal::anon_unknown_0::RemoveExtraPrecision
               (size_t extra_digits,bool has_leftover_value,Buffer *out,int *exp_out)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  
  pcVar1 = out->end;
  pcVar3 = pcVar1 + -extra_digits;
  out->end = pcVar3;
  if ('5' < *pcVar3) goto LAB_0033b964;
  if (*pcVar3 != '5') {
    return;
  }
  if (has_leftover_value) goto LAB_0033b964;
  pcVar5 = pcVar3 + 1;
  lVar7 = (long)(extra_digits - 1) >> 2;
  if (0 < lVar7) {
    pcVar5 = pcVar5 + (extra_digits - 1 & 0xfffffffffffffffc);
    lVar7 = lVar7 + 1;
    pcVar2 = pcVar3;
    do {
      pcVar6 = pcVar2 + 4;
      if (pcVar2[1] != '0') {
        pcVar6 = pcVar2 + 1;
        goto LAB_0033ba05;
      }
      if (pcVar2[2] != '0') {
        pcVar6 = pcVar2 + 2;
        goto LAB_0033ba05;
      }
      if (pcVar2[3] != '0') {
        pcVar6 = pcVar2 + 3;
        goto LAB_0033ba05;
      }
      if (*pcVar6 != '0') goto LAB_0033ba05;
      lVar7 = lVar7 + -1;
      pcVar2 = pcVar6;
    } while (1 < lVar7);
  }
  lVar7 = (long)pcVar1 - (long)pcVar5;
  if (lVar7 == 1) {
LAB_0033b9e7:
    pcVar6 = pcVar5;
    if (*pcVar5 != '0') goto LAB_0033ba05;
  }
  else {
    if (lVar7 == 2) {
LAB_0033b9df:
      pcVar6 = pcVar5;
      if (*pcVar5 == '0') {
        pcVar5 = pcVar5 + 1;
        goto LAB_0033b9e7;
      }
    }
    else {
      if (lVar7 != 3) goto LAB_0033ba0e;
      pcVar6 = pcVar5;
      if (*pcVar5 == '0') {
        pcVar5 = pcVar5 + 1;
        goto LAB_0033b9df;
      }
    }
LAB_0033ba05:
    if (pcVar6 != pcVar1) goto LAB_0033b964;
  }
LAB_0033ba0e:
  cVar4 = pcVar3[-1];
  if (cVar4 == '.') {
    cVar4 = pcVar3[-2];
  }
  if (((int)cVar4 & 0x80000001U) != 1) {
    return;
  }
LAB_0033b964:
  RoundUp<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1>
            (out,exp_out);
  return;
}

Assistant:

void RemoveExtraPrecision(size_t extra_digits,
                          bool has_leftover_value,
                          Buffer* out,
                          int* exp_out) {
  // Back out the extra digits
  out->end -= extra_digits;

  bool needs_to_round_up = [&] {
    // We look at the digit just past the end.
    // There must be 'extra_digits' extra valid digits after end.
    if (*out->end > '5') return true;
    if (*out->end < '5') return false;
    if (has_leftover_value || std::any_of(out->end + 1, out->end + extra_digits,
                                          [](char c) { return c != '0'; }))
      return true;

    // Ends in ...50*, round to even.
    return out->last_digit() % 2 == 1;
  }();

  if (needs_to_round_up) {
    RoundUp<FormatStyle::Precision>(out, exp_out);
  }
}